

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void gpt_print_usage(int param_1,char **argv,gpt_params *params)

{
  FILE *__stream;
  undefined8 uVar1;
  long in_RDX;
  undefined8 *in_RSI;
  
  fprintf(_stderr,"usage: %s [options]\n",*in_RSI);
  fprintf(_stderr,"\n");
  fprintf(_stderr,"options:\n");
  fprintf(_stderr,"  -h, --help            show this help message and exit\n");
  fprintf(_stderr,"  -s SEED, --seed SEED  RNG seed (default: -1)\n");
  fprintf(_stderr,
          "  -t N, --threads N     number of threads to use during computation (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 4));
  fprintf(_stderr,"  -p PROMPT, --prompt PROMPT\n");
  fprintf(_stderr,"                        prompt to start generation with (default: random)\n");
  fprintf(_stderr,"  -f FNAME, --file FNAME\n");
  fprintf(_stderr,"                        load prompt from a file\n");
  fprintf(_stderr,"  -tt TOKEN_TEST, --token_test TOKEN_TEST\n");
  fprintf(_stderr,"                        test tokenization\n");
  fprintf(_stderr,"  -n N, --n_predict N   number of tokens to predict (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 8));
  fprintf(_stderr,"  --top_k N             top-k sampling (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0x20));
  fprintf(_stderr,"  --top_p N             top-p sampling (default: %.1f)\n",
          (double)*(float *)(in_RDX + 0x24));
  fprintf(_stderr,"  --temp N              temperature (default: %.1f)\n",
          (double)*(float *)(in_RDX + 0x28));
  fprintf(_stderr,
          "  --repeat-last-n N     last n tokens to consider for penalize (default: %d, 0 = disabled)\n"
          ,(ulong)*(uint *)(in_RDX + 0x2c));
  fprintf(_stderr,
          "  --repeat-penalty N    penalize repeat sequence of tokens (default: %.2f, 1.0 = disabled)\n"
          ,(double)*(float *)(in_RDX + 0x30));
  fprintf(_stderr,"  -b N, --batch_size N  batch size for prompt processing (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0x10));
  fprintf(_stderr,"  -c N, --context N     context / KV cache size (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0x14));
  fprintf(_stderr,"  --ignore-eos          ignore EOS token during generation\n");
  fprintf(_stderr,
          "  -ngl N, --gpu-layers N  number of layers to offload to GPU on supported models (default: %d)\n"
          ,(ulong)*(uint *)(in_RDX + 0x18));
  fprintf(_stderr,"  -m FNAME, --model FNAME\n");
  __stream = _stderr;
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"                        model path (default: %s)\n",uVar1);
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void gpt_print_usage(int /*argc*/, char ** argv, const gpt_params & params) {
    fprintf(stderr, "usage: %s [options]\n", argv[0]);
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h, --help            show this help message and exit\n");
    fprintf(stderr, "  -s SEED, --seed SEED  RNG seed (default: -1)\n");
    fprintf(stderr, "  -t N, --threads N     number of threads to use during computation (default: %d)\n", params.n_threads);
    fprintf(stderr, "  -p PROMPT, --prompt PROMPT\n");
    fprintf(stderr, "                        prompt to start generation with (default: random)\n");
    fprintf(stderr, "  -f FNAME, --file FNAME\n");
    fprintf(stderr, "                        load prompt from a file\n");
    fprintf(stderr, "  -tt TOKEN_TEST, --token_test TOKEN_TEST\n");
    fprintf(stderr, "                        test tokenization\n");
    fprintf(stderr, "  -n N, --n_predict N   number of tokens to predict (default: %d)\n", params.n_predict);
    fprintf(stderr, "  --top_k N             top-k sampling (default: %d)\n", params.top_k);
    fprintf(stderr, "  --top_p N             top-p sampling (default: %.1f)\n", params.top_p);
    fprintf(stderr, "  --temp N              temperature (default: %.1f)\n", params.temp);
    fprintf(stderr, "  --repeat-last-n N     last n tokens to consider for penalize (default: %d, 0 = disabled)\n", params.repeat_last_n);
    fprintf(stderr, "  --repeat-penalty N    penalize repeat sequence of tokens (default: %.2f, 1.0 = disabled)\n", (double)params.repeat_penalty);
    fprintf(stderr, "  -b N, --batch_size N  batch size for prompt processing (default: %d)\n", params.n_batch);
    fprintf(stderr, "  -c N, --context N     context / KV cache size (default: %d)\n", params.n_ctx);
    fprintf(stderr, "  --ignore-eos          ignore EOS token during generation\n");
    fprintf(stderr, "  -ngl N, --gpu-layers N  number of layers to offload to GPU on supported models (default: %d)\n", params.n_gpu_layers);
    fprintf(stderr, "  -m FNAME, --model FNAME\n");
    fprintf(stderr, "                        model path (default: %s)\n", params.model.c_str());
    fprintf(stderr, "\n");
}